

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O3

void __thiscall HighsMipSolverData::runSetup(HighsMipSolverData *this)

{
  vector<double,_std::allocator<double>_> *Avalue;
  HighsDomain *globaldom;
  Highs *this_00;
  double *pdVar1;
  HighsInt HVar2;
  HighsInt HVar3;
  pointer pdVar4;
  HighsCallback *this_01;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  HighsInt *pHVar8;
  HighsOptions *pHVar9;
  pointer piVar10;
  pointer piVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  HighsMipSolver *pHVar19;
  int *piVar20;
  logic_error *this_02;
  char *pcVar21;
  ulong uVar22;
  HighsLp *pHVar23;
  long lVar24;
  uchar uVar25;
  uint uVar26;
  int *piVar27;
  HighsInt *pHVar28;
  int iVar29;
  iterator iVar30;
  vector<int,std::allocator<int>> *this_03;
  int *piVar31;
  HighsLp *pHVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  double dVar35;
  double dVar36;
  string local_1d8;
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  local_1b8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  _Base_ptr p_Stack_178;
  _Base_ptr local_170;
  
  pHVar19 = this->mipsolver;
  pHVar23 = pHVar19->model_;
  *(undefined4 *)&this->disptime = 0;
  *(undefined4 *)((long)&this->disptime + 4) = 0;
  *(undefined4 *)&this->last_disptime = 0;
  *(undefined4 *)((long)&this->last_disptime + 4) = 0xfff00000;
  dVar36 = pHVar23->offset_;
  dVar14 = this->upper_limit - dVar36;
  dVar35 = this->optimality_limit - dVar36;
  auVar12._8_4_ = SUB84(dVar35,0);
  auVar12._0_8_ = dVar14;
  auVar12._12_4_ = (int)((ulong)dVar35 >> 0x20);
  this->upper_limit = dVar14;
  this->optimality_limit = (double)auVar12._8_8_;
  dVar14 = this->lower_bound - dVar36;
  dVar36 = this->upper_bound - dVar36;
  auVar13._8_4_ = SUB84(dVar36,0);
  auVar13._0_8_ = dVar14;
  auVar13._12_4_ = (int)((ulong)dVar36 >> 0x20);
  this->lower_bound = dVar14;
  this->upper_bound = (double)auVar13._8_8_;
  if (pHVar19->solution_objective_ < INFINITY) {
    presolve::HighsPostsolveStack::getReducedPrimalSolution
              ((vector<double,_std::allocator<double>_> *)local_198,&this->postSolveStack,
               &pHVar19->solution_);
    pdVar4 = (this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_198._0_8_;
    (this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_198._8_8_;
    (this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_188._0_8_;
    local_198._0_8_ = (pointer)0x0;
    local_198._8_8_ = (pointer)0x0;
    local_188._0_8_ = (pointer)0x0;
    if ((pdVar4 != (pointer)0x0) &&
       (operator_delete(pdVar4), (pointer)local_198._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_198._0_8_);
    }
    pHVar19 = this->mipsolver;
    dVar36 = (pHVar19->options_mip_->super_HighsOptionsStruct).mip_feasibility_tolerance;
    if ((dVar36 < pHVar19->bound_violation_) || (dVar36 < pHVar19->integrality_violation_)) {
      bVar16 = false;
    }
    else {
      bVar16 = pHVar19->row_violation_ <= dVar36;
    }
    dVar36 = (double)pHVar19->orig_model_->sense_ * pHVar19->solution_objective_ -
             pHVar19->model_->offset_;
    if (this->numRestarts == 0) {
      pcVar21 = "infeasible";
      if (bVar16) {
        pcVar21 = "feasible";
      }
      highsLogUser(&(pHVar19->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                   "\nMIP start solution is %s, objective value is %.12g\n",pcVar21);
    }
    if (bVar16) {
      dVar14 = this->upper_bound;
      pHVar19 = this->mipsolver;
      if (dVar36 < dVar14) {
        this->upper_bound = dVar36;
        if (pHVar19->submip == false) {
          if ((dVar36 != dVar14) || (NAN(dVar36) || NAN(dVar14))) {
            updatePrimalDualIntegral
                      (this,this->lower_bound,this->lower_bound,dVar14,dVar36,false,false);
          }
        }
        dVar14 = computeNewUpperLimit(this,dVar36,0.0,0.0);
        saveReportMipSolution(this,dVar14);
        pHVar19 = this->mipsolver;
        if (dVar14 < this->upper_limit) {
          this->upper_limit = dVar14;
          dVar36 = computeNewUpperLimit
                             (this,dVar36,
                              (pHVar19->options_mip_->super_HighsOptionsStruct).mip_abs_gap,
                              (pHVar19->options_mip_->super_HighsOptionsStruct).mip_rel_gap);
          this->optimality_limit = dVar36;
          (this->nodequeue).optimality_limit = dVar36;
          pHVar19 = this->mipsolver;
        }
      }
      if (((pHVar19->submip == false) &&
          (this_01 = pHVar19->callback_,
          (this_01->user_callback).super__Function_base._M_manager != (_Manager_type)0x0)) &&
         ((*(this_01->active).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 8) != 0)) {
        HighsCallback::clearHighsCallbackDataOut(this_01);
        pHVar19 = this->mipsolver;
        (pHVar19->callback_->data_out).mip_solution =
             (pHVar19->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        dVar36 = pHVar19->solution_objective_;
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Feasible solution","")
        ;
        interruptFromCallbackWithData(this,3,dVar36,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
      }
    }
  }
  if (this->mipsolver->model_->num_col_ == 0) {
    local_198._0_8_ = (pointer)0x0;
    local_198._8_8_ = (pointer)0x0;
    local_188._0_8_ = (pointer)0x0;
    addIncumbent(this,(vector<double,_std::allocator<double>_> *)local_198,0.0,5,true,false);
    if ((pointer)local_198._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_198._0_8_);
    }
  }
  local_188._8_8_ = (pointer)0x0;
  p_Stack_178 = (_Base_ptr)0x0;
  local_170 = (_Base_ptr)0x0;
  local_1b8.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->redcostfixing).lurkingColUpper.
       super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1b8.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->redcostfixing).lurkingColUpper.
       super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1b8.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->redcostfixing).lurkingColUpper.
       super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->redcostfixing).lurkingColUpper.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->redcostfixing).lurkingColUpper.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->redcostfixing).lurkingColUpper.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198._0_8_ = (pointer)0x0;
  local_198._8_8_ = (pointer)0x0;
  local_188._0_8_ = (pointer)0x0;
  std::
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ::~vector(&local_1b8);
  local_1b8.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->redcostfixing).lurkingColLower.
       super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->redcostfixing).lurkingColLower.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_170;
  local_1b8.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->redcostfixing).lurkingColLower.
       super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1b8.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->redcostfixing).lurkingColLower.
       super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->redcostfixing).lurkingColLower.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_188._8_8_;
  (this->redcostfixing).lurkingColLower.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Stack_178;
  local_188._8_8_ = (pointer)0x0;
  p_Stack_178 = (_Base_ptr)0x0;
  local_170 = (_Base_ptr)0x0;
  std::
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ::~vector(&local_1b8);
  std::
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ::~vector((vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
             *)(local_188 + 8));
  std::
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ::~vector((vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
             *)local_198);
  HighsPseudocost::HighsPseudocost((HighsPseudocost *)local_198,this->mipsolver);
  HighsPseudocost::operator=(&this->pseudocost,(HighsPseudocost *)local_198);
  HighsPseudocost::~HighsPseudocost((HighsPseudocost *)local_198);
  HighsNodeQueue::setNumCol(&this->nodequeue,this->mipsolver->model_->num_col_);
  (this->nodequeue).optimality_limit = this->optimality_limit;
  piVar5 = (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar5;
  }
  piVar5 = (this->integer_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->integer_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    (this->integer_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar5;
  }
  piVar5 = (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar5;
  }
  piVar5 = (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar5;
  }
  this->rowMatrixSet = true;
  Avalue = &(pHVar23->a_matrix_).value_;
  highsSparseTranspose
            (pHVar23->num_row_,pHVar23->num_col_,&(pHVar23->a_matrix_).start_,
             &(pHVar23->a_matrix_).index_,Avalue,&this->ARstart_,&this->ARindex_,&this->ARvalue_);
  local_198._0_8_ = local_198._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->uplocks,(long)pHVar23->num_col_,(value_type_conflict2 *)local_198);
  local_198._0_8_ = local_198._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->downlocks,(long)pHVar23->num_col_,(value_type_conflict2 *)local_198);
  uVar26 = pHVar23->num_col_;
  if (uVar26 != 0) {
    piVar5 = (pHVar23->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar22 = 0;
    do {
      iVar17 = piVar5[uVar22];
      lVar24 = (long)iVar17;
      iVar29 = piVar5[uVar22 + 1];
      if (iVar29 != iVar17) {
        piVar6 = (pHVar23->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (pHVar23->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (pHVar23->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar31 = (this->downlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar22;
        piVar20 = (this->uplocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar22;
        iVar29 = iVar29 - iVar17;
        do {
          iVar17 = piVar6[lVar24];
          if (-INFINITY < pdVar4[iVar17]) {
            pdVar1 = (Avalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar24;
            piVar27 = piVar31;
            if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
              piVar27 = piVar20;
            }
            *piVar27 = *piVar27 + 1;
          }
          if (pdVar7[iVar17] < INFINITY) {
            pdVar1 = (Avalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar24;
            piVar27 = piVar20;
            if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
              piVar27 = piVar31;
            }
            *piVar27 = *piVar27 + 1;
          }
          lVar24 = lVar24 + 1;
          iVar29 = iVar29 + -1;
        } while (iVar29 != 0);
        uVar26 = pHVar23->num_col_;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != uVar26);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->rowintegral,(long)this->mipsolver->model_->num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->maxAbsRowCoef,(long)this->mipsolver->model_->num_row_);
  pHVar32 = this->mipsolver->model_;
  if (pHVar32->num_row_ != 0) {
    uVar22 = 0;
    uVar33 = 0xffffffff;
    uVar34 = 0x7fffffff;
    do {
      piVar5 = (this->ARstart_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar17 = piVar5[uVar22];
      iVar29 = piVar5[uVar22 + 1];
      dVar36 = 0.0;
      if (iVar29 == iVar17) {
LAB_002b7dad:
        pdVar4 = (this->presolvedModel).row_lower_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        dVar14 = pdVar4[uVar22];
        if (-INFINITY < dVar14) {
          dVar14 = ceil(dVar14 - this->feastol);
          pdVar4[uVar22] = dVar14;
        }
        pdVar4 = (this->presolvedModel).row_upper_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        dVar14 = pdVar4[uVar22];
        uVar25 = '\x01';
        if (dVar14 < INFINITY) {
          dVar14 = floor(dVar14 + this->feastol);
          pdVar4[uVar22] = dVar14;
        }
        uVar33 = 0xffffffff;
        uVar34 = 0x7fffffff;
      }
      else {
        dVar14 = this->epsilon;
        pdVar4 = (this->ARvalue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar5 = (this->ARindex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar16 = true;
        lVar24 = 0;
        dVar35 = 0.0;
        do {
          if ((bVar16) &&
             ((pHVar32->integrality_).
              super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
              super__Vector_impl_data._M_start[piVar5[iVar17 + lVar24]] != kContinuous)) {
            dVar36 = pdVar4[iVar17 + lVar24];
            dVar15 = round(dVar36);
            uVar33 = (undefined4)DAT_003bf3e0;
            uVar34 = DAT_003bf3e0._4_4_;
            bVar16 = (double)((ulong)(dVar36 - dVar15) & (ulong)DAT_003bf3e0) <= dVar14;
          }
          else {
            bVar16 = false;
          }
          dVar36 = (double)((ulong)pdVar4[iVar17 + lVar24] & CONCAT44(uVar34,uVar33));
          if (dVar36 <= dVar35) {
            dVar36 = dVar35;
          }
          lVar24 = lVar24 + 1;
          dVar35 = dVar36;
        } while (iVar29 - iVar17 != (int)lVar24);
        if (bVar16) goto LAB_002b7dad;
        uVar25 = '\0';
      }
      (this->rowintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar22] = uVar25;
      (this->maxAbsRowCoef).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar22] = dVar36;
      uVar22 = uVar22 + 1;
      pHVar32 = this->mipsolver->model_;
    } while (uVar22 != (uint)pHVar32->num_row_);
  }
  globaldom = &this->domain;
  HighsObjectiveFunction::setupCliquePartition
            (&this->objectiveFunction,globaldom,&this->cliquetable);
  HighsDomain::setupObjectivePropagation(globaldom);
  HighsDomain::computeRowActivities(globaldom);
  HighsDomain::propagate(globaldom);
  if ((this->domain).infeasible_ == false) {
    if (pHVar23->num_col_ == 0) {
      this->mipsolver->modelstatus_ = kOptimal;
    }
    else {
      bVar16 = checkLimits(this,0);
      if (!bVar16) {
        pHVar28 = (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pHVar8 = (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pHVar28 != pHVar8) {
          do {
            HighsImplications::cleanupVarbounds(&this->implications,*pHVar28);
            pHVar28 = pHVar28 + 1;
          } while (pHVar28 != pHVar8);
          piVar20 = (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          piVar31 = (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (piVar20 != piVar31) {
            do {
              (globaldom->changedcolsflags_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[*piVar20] = '\0';
              piVar20 = piVar20 + 1;
            } while (piVar20 != piVar31);
            piVar5 = (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish != piVar5) {
              (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = piVar5;
            }
          }
        }
        local_198._0_8_ = (pointer)local_188;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"presolve","");
        this_00 = &(this->lp).lpsolver;
        Highs::setOptionValue(this_00,(string *)local_198,&::kHighsOffString_abi_cxx11_);
        if ((pointer)local_198._0_8_ != (pointer)local_188) {
          operator_delete((void *)local_198._0_8_);
        }
        local_198._0_8_ = (pointer)local_188;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_198,"simplex_initial_condition_check","");
        Highs::setOptionValue(this_00,(string *)local_198,false);
        if ((pointer)local_198._0_8_ != (pointer)local_188) {
          operator_delete((void *)local_198._0_8_);
        }
        checkObjIntegrality(this);
        pdVar4 = (this->rootlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->rootlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != pdVar4) {
          (this->rootlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar4;
        }
        pdVar4 = (this->firstlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->firstlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != pdVar4) {
          (this->firstlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar4;
        }
        uVar26 = 0;
        this->maxTreeSizeLog2 = 0;
        local_198._0_8_ = local_198._0_8_ & 0xffffffff00000000;
        pHVar19 = this->mipsolver;
        pHVar23 = pHVar19->model_;
        if (pHVar23->num_col_ != 0) {
          uVar26 = 0;
          iVar17 = 0;
          do {
            switch((pHVar23->integrality_).
                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar17]) {
            case kContinuous:
              dVar36 = (this->domain).col_lower_.super__Vector_base<double,_std::allocator<double>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar17];
              pdVar1 = (this->domain).col_upper_.super__Vector_base<double,_std::allocator<double>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar17;
              if ((dVar36 != *pdVar1) || (NAN(dVar36) || NAN(*pdVar1))) {
                iVar30._M_current =
                     (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                this_03 = (vector<int,std::allocator<int>> *)&this->continuous_cols;
                if (iVar30._M_current ==
                    (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
LAB_002b8207:
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (this_03,iVar30,(int *)local_198);
                }
                else {
                  *iVar30._M_current = iVar17;
                  (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar30._M_current + 1;
                }
              }
              break;
            case kInteger:
              dVar36 = (this->domain).col_lower_.super__Vector_base<double,_std::allocator<double>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar17];
              pdVar1 = (this->domain).col_upper_.super__Vector_base<double,_std::allocator<double>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar17;
              if ((dVar36 != *pdVar1) || (NAN(dVar36) || NAN(*pdVar1))) {
                iVar30._M_current =
                     (this->integer_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar30._M_current ==
                    (this->integer_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&this->integer_cols,iVar30,
                             (int *)local_198);
                }
                else {
                  *iVar30._M_current = iVar17;
                  (this->integer_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar30._M_current + 1;
                }
                iVar30._M_current =
                     (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar30._M_current ==
                    (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&this->integral_cols,iVar30,
                             (int *)local_198);
                }
                else {
                  *iVar30._M_current = local_198._0_4_;
                  (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar30._M_current + 1;
                }
                pHVar23 = this->mipsolver->model_;
                dVar36 = ((pHVar23->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[(int)local_198._0_4_] + 1.0) -
                         (pHVar23->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[(int)local_198._0_4_];
                if (1024.0 <= dVar36) {
                  dVar36 = 1024.0;
                }
                dVar36 = log2(dVar36);
                dVar36 = ceil(dVar36);
                this->maxTreeSizeLog2 = this->maxTreeSizeLog2 + (int)dVar36;
                pHVar23 = this->mipsolver->model_;
                uVar26 = uVar26 + ((pHVar23->col_lower_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start[(int)local_198._0_4_] == 0.0 &&
                                  (pHVar23->col_upper_).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[(int)local_198._0_4_] == 1.0);
              }
              else {
                dVar14 = round(dVar36);
                if (this->feastol <= ABS(dVar36 - dVar14) && ABS(dVar36 - dVar14) != this->feastol)
                {
                  pHVar19->modelstatus_ = kInfeasible;
                  uVar33 = SUB84(this->lower_bound,0);
                  uVar34 = (undefined4)((ulong)this->lower_bound >> 0x20);
                  this->lower_bound = INFINITY;
                  if (pHVar19->submip != false) goto LAB_002b7eec;
                  goto LAB_002b7ec2;
                }
              }
              break;
            case kSemiContinuous:
            case kSemiInteger:
              highsLogUser(&(pHVar19->options_mip_->super_HighsOptionsStruct).log_options,kError,
                           "Semicontinuous or semiinteger variables should have been reformulated away before HighsMipSolverData::runSetup() is called."
                          );
              this_02 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(this_02,"Unexpected variable type");
              __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            case kImplicitInteger:
              dVar36 = (this->domain).col_lower_.super__Vector_base<double,_std::allocator<double>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar17];
              pdVar1 = (this->domain).col_upper_.super__Vector_base<double,_std::allocator<double>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar17;
              if ((dVar36 != *pdVar1) || (NAN(dVar36) || NAN(*pdVar1))) {
                iVar30._M_current =
                     (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar30._M_current ==
                    (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&this->implint_cols,iVar30,
                             (int *)local_198);
                }
                else {
                  *iVar30._M_current = iVar17;
                  (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar30._M_current + 1;
                }
                iVar30._M_current =
                     (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                this_03 = (vector<int,std::allocator<int>> *)&this->integral_cols;
                if (iVar30._M_current ==
                    (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) goto LAB_002b8207;
                *iVar30._M_current = local_198._0_4_;
                (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar30._M_current + 1;
              }
            }
            iVar17 = local_198._0_4_ + 1;
            local_198._0_4_ = iVar17;
            pHVar19 = this->mipsolver;
            pHVar23 = pHVar19->model_;
          } while (iVar17 != pHVar23->num_col_);
        }
        basisTransfer(this);
        iVar17 = (int)((ulong)((long)(this->integer_cols).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->integer_cols).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2);
        this->numintegercols = iVar17;
        this->detectSymmetries = (bool)(this->detectSymmetries & 0 < (int)uVar26);
        HVar2 = (this->cliquetable).numEntries;
        this->numCliqueEntriesAfterPresolve = HVar2;
        if (this->numRestarts == 0) {
          this->numCliqueEntriesAfterFirstPresolve = HVar2;
          pcVar21 = 
          "\nSolving MIP model with:\n   %d rows\n   %d cols (%d binary, %d integer, %d implied int., %d continuous)\n   %d nonzeros\n"
          ;
        }
        else {
          pcVar21 = 
          "Model after restart has %d rows, %d cols (%d bin., %d int., %d impl., %d cont.), and %d nonzeros\n"
          ;
        }
        pHVar9 = this->mipsolver->options_mip_;
        pHVar23 = this->mipsolver->model_;
        HVar2 = pHVar23->num_col_;
        HVar3 = pHVar23->num_row_;
        piVar5 = (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar6 = (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar10 = (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        piVar11 = (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar18 = HighsSparseMatrix::numNz(&pHVar23->a_matrix_);
        highsLogUser(&(pHVar9->super_HighsOptionsStruct).log_options,kInfo,pcVar21,HVar3,HVar2,
                     (ulong)uVar26,(ulong)(iVar17 - uVar26),
                     (ulong)((long)piVar5 - (long)piVar6) >> 2,
                     (ulong)((long)piVar10 - (long)piVar11) >> 2,(ulong)uVar18);
        HighsPrimalHeuristics::setupIntCols(&this->heuristics);
        if (INFINITY <= this->upper_limit) {
          this->analyticCenterComputed = false;
        }
        this->analyticCenterStatus = kMin;
        pdVar4 = (this->analyticCenter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->analyticCenter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != pdVar4) {
          (this->analyticCenter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar4;
        }
        HighsSymmetries::clear(&this->symmetries);
        if (this->numRestarts != 0) {
          highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                       "\n");
        }
      }
    }
  }
  else {
    pHVar19 = this->mipsolver;
    pHVar19->modelstatus_ = kInfeasible;
    uVar33 = SUB84(this->lower_bound,0);
    uVar34 = (undefined4)((ulong)this->lower_bound >> 0x20);
    this->lower_bound = INFINITY;
    if (pHVar19->submip == false) {
LAB_002b7ec2:
      if ((double)CONCAT44(uVar34,uVar33) < INFINITY) {
        updatePrimalDualIntegral
                  (this,(double)CONCAT44(uVar34,uVar33),INFINITY,this->upper_bound,this->upper_bound
                   ,false,false);
      }
    }
LAB_002b7eec:
    (this->pruned_treeweight).hi = 1.0;
    (this->pruned_treeweight).lo = 0.0;
  }
  return;
}

Assistant:

void HighsMipSolverData::runSetup() {
  const HighsLp& model = *mipsolver.model_;

  last_disptime = -kHighsInf;
  disptime = 0;

  // Transform the reference of the objective limit and lower/upper
  // bounds from the original model to the current model, undoing the
  // transformation done before restart so that the offset change due
  // to presolve is incorporated. Bound changes are transitory, so no
  // real gap change, and no update to P-D integral is necessary
  upper_limit -= mipsolver.model_->offset_;
  optimality_limit -= mipsolver.model_->offset_;

  lower_bound -= mipsolver.model_->offset_;
  upper_bound -= mipsolver.model_->offset_;

  if (mipsolver.solution_objective_ != kHighsInf) {
    incumbent = postSolveStack.getReducedPrimalSolution(mipsolver.solution_);
    // return the objective value in the transformed space
    double solobj =
        mipsolver.solution_objective_ * (int)mipsolver.orig_model_->sense_ -
        mipsolver.model_->offset_;
    bool feasible = mipsolver.bound_violation_ <=
                        mipsolver.options_mip_->mip_feasibility_tolerance &&
                    mipsolver.integrality_violation_ <=
                        mipsolver.options_mip_->mip_feasibility_tolerance &&
                    mipsolver.row_violation_ <=
                        mipsolver.options_mip_->mip_feasibility_tolerance;
    if (numRestarts == 0) {
      highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                   "\nMIP start solution is %s, objective value is %.12g\n",
                   feasible ? "feasible" : "infeasible",
                   mipsolver.solution_objective_);
    }
    if (feasible && solobj < upper_bound) {
      double prev_upper_bound = upper_bound;

      upper_bound = solobj;

      bool bound_change = upper_bound != prev_upper_bound;
      if (!mipsolver.submip && bound_change)
        updatePrimalDualIntegral(lower_bound, lower_bound, prev_upper_bound,
                                 upper_bound);

      double new_upper_limit = computeNewUpperLimit(solobj, 0.0, 0.0);
      saveReportMipSolution(new_upper_limit);
      if (new_upper_limit < upper_limit) {
        upper_limit = new_upper_limit;
        optimality_limit =
            computeNewUpperLimit(solobj, mipsolver.options_mip_->mip_abs_gap,
                                 mipsolver.options_mip_->mip_rel_gap);
        nodequeue.setOptimalityLimit(optimality_limit);
      }
    }
    if (!mipsolver.submip && feasible && mipsolver.callback_->user_callback &&
        mipsolver.callback_->active[kCallbackMipSolution]) {
      assert(!mipsolver.submip);
      mipsolver.callback_->clearHighsCallbackDataOut();
      mipsolver.callback_->data_out.mip_solution = mipsolver.solution_.data();
      const bool interrupt = interruptFromCallbackWithData(
          kCallbackMipSolution, mipsolver.solution_objective_,
          "Feasible solution");
      assert(!interrupt);
    }
  }

  if (mipsolver.numCol() == 0)
    addIncumbent(std::vector<double>(), 0, kSolutionSourceEmptyMip);

  redcostfixing = HighsRedcostFixing();
  pseudocost = HighsPseudocost(mipsolver);
  nodequeue.setNumCol(mipsolver.numCol());
  nodequeue.setOptimalityLimit(optimality_limit);

  continuous_cols.clear();
  integer_cols.clear();
  implint_cols.clear();
  integral_cols.clear();

  rowMatrixSet = false;
  if (!rowMatrixSet) {
    rowMatrixSet = true;
    highsSparseTranspose(model.num_row_, model.num_col_, model.a_matrix_.start_,
                         model.a_matrix_.index_, model.a_matrix_.value_,
                         ARstart_, ARindex_, ARvalue_);
    // (re-)initialize number of uplocks and downlocks
    uplocks.assign(model.num_col_, 0);
    downlocks.assign(model.num_col_, 0);
    for (HighsInt i = 0; i != model.num_col_; ++i) {
      HighsInt start = model.a_matrix_.start_[i];
      HighsInt end = model.a_matrix_.start_[i + 1];
      for (HighsInt j = start; j != end; ++j) {
        HighsInt row = model.a_matrix_.index_[j];

        if (model.row_lower_[row] != -kHighsInf) {
          if (model.a_matrix_.value_[j] < 0)
            ++uplocks[i];
          else
            ++downlocks[i];
        }
        if (model.row_upper_[row] != kHighsInf) {
          if (model.a_matrix_.value_[j] < 0)
            ++downlocks[i];
          else
            ++uplocks[i];
        }
      }
    }
  }

  rowintegral.resize(mipsolver.model_->num_row_);

  // compute the maximal absolute coefficients to filter propagation
  maxAbsRowCoef.resize(mipsolver.model_->num_row_);
  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    double maxabsval = 0.0;

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];
    bool integral = true;
    for (HighsInt j = start; j != end; ++j) {
      integral =
          integral &&
          mipsolver.variableType(ARindex_[j]) != HighsVarType::kContinuous &&
          fractionality(ARvalue_[j]) <= epsilon;

      maxabsval = std::max(maxabsval, std::abs(ARvalue_[j]));
    }

    if (integral) {
      if (presolvedModel.row_lower_[i] != -kHighsInf)
        presolvedModel.row_lower_[i] =
            std::ceil(presolvedModel.row_lower_[i] - feastol);

      if (presolvedModel.row_upper_[i] != kHighsInf)
        presolvedModel.row_upper_[i] =
            std::floor(presolvedModel.row_upper_[i] + feastol);
    }

    rowintegral[i] = integral;
    maxAbsRowCoef[i] = maxabsval;
  }

  // compute row activities and propagate all rows once
  objectiveFunction.setupCliquePartition(domain, cliquetable);
  domain.setupObjectivePropagation();
  domain.computeRowActivities();
  domain.propagate();
  if (domain.infeasible()) {
    mipsolver.modelstatus_ = HighsModelStatus::kInfeasible;

    double prev_lower_bound = lower_bound;

    lower_bound = kHighsInf;

    bool bound_change = lower_bound != prev_lower_bound;
    if (!mipsolver.submip && bound_change)
      updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                               upper_bound);

    pruned_treeweight = 1.0;
    return;
  }

  if (model.num_col_ == 0) {
    mipsolver.modelstatus_ = HighsModelStatus::kOptimal;
    return;
  }

  if (checkLimits()) return;
  // extract cliques if they have not been extracted before

  for (HighsInt col : domain.getChangedCols())
    implications.cleanupVarbounds(col);
  domain.clearChangedCols();

  lp.getLpSolver().setOptionValue("presolve", kHighsOffString);
  // lp.getLpSolver().setOptionValue("dual_simplex_cost_perturbation_multiplier",
  // 0.0); lp.getLpSolver().setOptionValue("parallel", kHighsOnString);
  lp.getLpSolver().setOptionValue("simplex_initial_condition_check", false);

  checkObjIntegrality();
  rootlpsol.clear();
  firstlpsol.clear();
  HighsInt numBin = 0;

  maxTreeSizeLog2 = 0;
  for (HighsInt i = 0; i != mipsolver.numCol(); ++i) {
    switch (mipsolver.variableType(i)) {
      case HighsVarType::kContinuous:
        if (domain.isFixed(i)) continue;
        continuous_cols.push_back(i);
        break;
      case HighsVarType::kImplicitInteger:
        if (domain.isFixed(i)) continue;
        implint_cols.push_back(i);
        integral_cols.push_back(i);
        break;
      case HighsVarType::kInteger:
        if (domain.isFixed(i)) {
          if (fractionality(domain.col_lower_[i]) > feastol) {
            // integer variable is fixed to a fractional value -> infeasible
            mipsolver.modelstatus_ = HighsModelStatus::kInfeasible;

            double prev_lower_bound = lower_bound;

            lower_bound = kHighsInf;

            bool bound_change = lower_bound != prev_lower_bound;
            if (!mipsolver.submip && bound_change)
              updatePrimalDualIntegral(prev_lower_bound, lower_bound,
                                       upper_bound, upper_bound);

            pruned_treeweight = 1.0;
            return;
          }
          continue;
        }
        integer_cols.push_back(i);
        integral_cols.push_back(i);
        maxTreeSizeLog2 += (HighsInt)std::ceil(
            std::log2(std::min(1024.0, 1.0 + mipsolver.model_->col_upper_[i] -
                                           mipsolver.model_->col_lower_[i])));
        // NB Since this is for counting the number of times the
        // condition is true using the bitwise operator avoids having
        // any conditional branch whereas using the logical operator
        // would require a branch due to short circuit
        // evaluation. Semantically both is equivalent and correct. If
        // there was any code to be executed for the condition being
        // true then there would be a conditional branch in any case
        // and I would have used the logical to begin with.
        //
        // Hence any compiler warning can be ignored safely
        numBin +=
            (static_cast<HighsInt>(mipsolver.model_->col_lower_[i] == 0.0) &
             static_cast<HighsInt>(mipsolver.model_->col_upper_[i] == 1.0));
        break;
      case HighsVarType::kSemiContinuous:
      case HighsVarType::kSemiInteger:
        highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kError,
                     "Semicontinuous or semiinteger variables should have been "
                     "reformulated away before HighsMipSolverData::runSetup() "
                     "is called.");
        throw std::logic_error("Unexpected variable type");
    }
  }

  basisTransfer();

  numintegercols = integer_cols.size();
  detectSymmetries = detectSymmetries && numBin > 0;
  numCliqueEntriesAfterPresolve = cliquetable.getNumEntries();

  if (numRestarts == 0) {
    numCliqueEntriesAfterFirstPresolve = cliquetable.getNumEntries();
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 // clang-format off
               "\nSolving MIP model with:\n"
               "   %" HIGHSINT_FORMAT " rows\n"
               "   %" HIGHSINT_FORMAT " cols (%" HIGHSINT_FORMAT" binary, %" HIGHSINT_FORMAT " integer, %" HIGHSINT_FORMAT" implied int., %" HIGHSINT_FORMAT " continuous)\n"
               "   %" HIGHSINT_FORMAT " nonzeros\n",
                 // clang-format on
                 mipsolver.numRow(), mipsolver.numCol(), numBin,
                 numintegercols - numBin, (HighsInt)implint_cols.size(),
                 (HighsInt)continuous_cols.size(), mipsolver.numNonzero());
  } else {
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "Model after restart has %" HIGHSINT_FORMAT
                 " rows, %" HIGHSINT_FORMAT " cols (%" HIGHSINT_FORMAT
                 " bin., %" HIGHSINT_FORMAT " int., %" HIGHSINT_FORMAT
                 " impl., %" HIGHSINT_FORMAT " cont.), and %" HIGHSINT_FORMAT
                 " nonzeros\n",
                 mipsolver.numRow(), mipsolver.numCol(), numBin,
                 numintegercols - numBin, (HighsInt)implint_cols.size(),
                 (HighsInt)continuous_cols.size(), mipsolver.numNonzero());
  }

  heuristics.setupIntCols();

#ifdef HIGHS_DEBUGSOL
  if (numRestarts == 0) {
    debugSolution.activate();
    assert(!debugSolution.debugSolActive ||
           checkSolution(debugSolution.debugSolution));
  }
#endif

  if (upper_limit == kHighsInf) analyticCenterComputed = false;
  analyticCenterStatus = HighsModelStatus::kNotset;
  analyticCenter.clear();

  symmetries.clear();

  if (numRestarts != 0)
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "\n");
}